

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

int32 rw::d3d8::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  long lVar1;
  undefined4 local_40;
  undefined4 local_3c;
  int32 i;
  int32 size;
  InstanceData *inst;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(long *)((long)object + 0x98) == 0) || (**(int **)((long)object + 0x98) != 8)) {
    object_local._4_4_ = 0;
  }
  else {
    lVar1 = *(long *)((long)object + 0x98);
    _i = *(long *)(lVar1 + 8);
    local_3c = (uint)*(ushort *)(lVar1 + 6) * 0x2c + 0x18;
    for (local_40 = 0; local_40 < (int)(uint)*(ushort *)(lVar1 + 6); local_40 = local_40 + 1) {
      local_3c = *(int *)(_i + 0xc) * 2 + *(int *)(_i + 8) * *(int *)(_i + 4) + local_3c;
      _i = _i + 0x38;
    }
    object_local._4_4_ = local_3c;
  }
  return object_local._4_4_;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D8)
		return 0;

	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	InstanceData *inst = header->inst;
	int32 size = 12 + 4 + 4 + 4 + header->numMeshes*0x2C;
	for(int32 i = 0; i < header->numMeshes; i++){
		size += inst->numIndices*2 + inst->numVertices*inst->stride;
		inst++;
	}
	return size;
}